

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDManagedMeshFragment::ReserveCapacity(ON_SubDManagedMeshFragment *this,uint display_density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ON_SubDMeshFragmentGrid local_48;
  
  Clear(this);
  if (display_density < 7) {
    uVar6 = ON_SubDMeshFragment::PointCountFromDisplayDensity(display_density);
    if (((this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff) < uVar6) {
      ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
      ON_SubDMeshFragment::ClearControlNetQuad(&this->super_ON_SubDMeshFragment);
      ON_SubDMeshFragment::Internal_LayoutArrays
                (&this->super_ON_SubDMeshFragment,(ulong)uVar6,(double *)0x0);
    }
    ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,(ulong)uVar6);
    dVar5 = ON_BoundingBox::NanBoundingBox.m_max.z;
    dVar4 = ON_BoundingBox::NanBoundingBox.m_max.x;
    dVar3 = ON_BoundingBox::NanBoundingBox.m_min.z;
    dVar2 = ON_BoundingBox::NanBoundingBox.m_min.y;
    dVar1 = ON_BoundingBox::NanBoundingBox.m_min.x;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.y =
         ON_BoundingBox::NanBoundingBox.m_max.y;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.z = dVar5;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.z = dVar3;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.x = dVar4;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.x = dVar1;
    (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.y = dVar2;
    ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(&local_48,display_density,0);
    (this->super_ON_SubDMeshFragment).m_grid.m_prev_level_of_detail =
         local_48.m_prev_level_of_detail;
    (this->super_ON_SubDMeshFragment).m_grid.m_next_level_of_detail =
         local_48.m_next_level_of_detail;
    (this->super_ON_SubDMeshFragment).m_grid.m_F = local_48.m_F;
    (this->super_ON_SubDMeshFragment).m_grid.m_S = local_48.m_S;
    (this->super_ON_SubDMeshFragment).m_grid.m_reserved1 = local_48.m_reserved1;
    (this->super_ON_SubDMeshFragment).m_grid.m_reserved2 = local_48.m_reserved2;
    (this->super_ON_SubDMeshFragment).m_grid.m_side_segment_count = local_48.m_side_segment_count;
    (this->super_ON_SubDMeshFragment).m_grid.m_reserved3 = local_48.m_reserved3;
    (this->super_ON_SubDMeshFragment).m_grid.m_F_count = local_48.m_F_count;
    (this->super_ON_SubDMeshFragment).m_grid.m_F_level_of_detail = local_48.m_F_level_of_detail;
    (this->super_ON_SubDMeshFragment).m_grid.m_F_stride = local_48.m_F_stride;
    (this->super_ON_SubDMeshFragment).m_grid.m_reserved4 = local_48.m_reserved4;
    (this->super_ON_SubDMeshFragment).m_grid.m_reserved5 = local_48.m_reserved5;
    if ((this->super_ON_SubDMeshFragment).m_grid.m_F != (uint *)0x0) {
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDManagedMeshFragment::ReserveCapacity(
  unsigned int display_density
) ON_NOEXCEPT
{
  Clear();

  if ( display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(false);


  const unsigned int vertex_capacity = ON_SubDManagedMeshFragment::PointCountFromDisplayDensity(display_density);
  if (vertex_capacity > this->VertexCapacity())
  {
    this->DeleteManagedArrays();
    ClearControlNetQuad();
    // ON_SubDManagedMeshFragment manages m_storage and m_P[]/m_N[]/m_T[]/m_K[]/m_C[]) 
    // are not managed by ON_SubDMeshFragment.
    // (ON_SubDManagedMeshFragment is a legacy class that should not be used 
    // and this confusing situation is an artifact from early code.)
    Internal_LayoutArrays( vertex_capacity, nullptr );
  }
  SetVertexCount(vertex_capacity);

  ClearSurfaceBoundingBox();

  m_grid = ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density,0U);
  if ( nullptr == m_grid.m_F)
    return ON_SUBD_RETURN_ERROR(false);

  return true;
}